

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *rhs)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>> *__s2;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>> *__s1;
  uint uVar4;
  
  if ((*(ushort *)(this + 0xe) >> 0xc & 1) == 0) {
    uVar4 = *(uint *)this;
  }
  else {
    uVar4 = 0xd - (int)(char)this[0xd];
  }
  uVar1 = (rhs->data_).f.flags;
  if ((uVar1 >> 0xc & 1) == 0) {
    uVar2 = (rhs->data_).s.length;
  }
  else {
    uVar2 = 0xd - (int)(rhs->data_).ss.str[0xd];
  }
  if (uVar4 == uVar2) {
    __s1 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)(*(ulong *)(this + 8) & 0xffffffffffff);
    if ((*(ushort *)(this + 0xe) >> 0xc & 1) != 0) {
      __s1 = this;
    }
    __s2 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)((ulong)(rhs->data_).s.str & 0xffffffffffff);
    if ((uVar1 >> 0xc & 1) != 0) {
      __s2 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rhs;
    }
    if (__s1 != __s2) {
      iVar3 = bcmp(__s1,__s2,(ulong)uVar4);
      return iVar3 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

SizeType GetStringLength() const { RAPIDJSON_ASSERT(IsString()); return ((data_.f.flags & kInlineStrFlag) ? (data_.ss.GetLength()) : data_.s.length); }